

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O1

int sndio_stream_init(cubeb_conflict2 *context,cubeb_stream_conflict2 **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict2 data_callback,
                     cubeb_state_callback_conflict2 state_callback,void *user_ptr)

{
  uint uVar1;
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var2;
  cubeb_sample_format cVar3;
  int iVar4;
  cubeb_stream_conflict2 *__s;
  void *pvVar5;
  char *pcVar6;
  sio_hdl *psVar7;
  uchar *puVar8;
  uint32_t uVar9;
  char *pcVar10;
  ulong uVar11;
  sio_par rpar;
  sio_par local_b8;
  cubeb_stream_conflict2 **local_78;
  sio_par local_70;
  
  uVar9 = (uint32_t)input_device;
  __s = (cubeb_stream_conflict2 *)malloc(0xa8);
  if (__s == (cubeb_stream_conflict2 *)0x0) {
    return -1;
  }
  local_78 = stream;
  pvVar5 = memset(__s,0,0xa8);
  cVar3 = (cubeb_sample_format)pvVar5;
  if (input_stream_params != (cubeb_stream_params *)0x0) {
    if ((input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_0011173d;
    __s->mode = 2;
    cVar3 = input_stream_params->format;
    uVar9 = input_stream_params->rate;
  }
  if (output_stream_params != (cubeb_stream_params *)0x0) {
    if ((output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_0011173d;
    *(byte *)&__s->mode = (byte)__s->mode | 1;
    cVar3 = output_stream_params->format;
    uVar9 = output_stream_params->rate;
  }
  uVar1 = __s->mode;
  if (uVar1 != 0) {
    __s->context = context;
    p_Var2 = cubeb_sio_open;
    pcVar6 = getenv("AUDIODEVICE");
    if (pcVar6 == (char *)0x0) {
      pcVar10 = "snd/0";
    }
    else {
      pcVar10 = "snd/0";
      if (*pcVar6 != '\0') {
        pcVar10 = pcVar6;
      }
    }
    psVar7 = (*p_Var2)(pcVar10,uVar1,1);
    __s->hdl = psVar7;
    if (psVar7 != (sio_hdl *)0x0) {
      (*cubeb_sio_initpar)(&local_b8);
      local_b8.sig = 1;
      if (cVar3 == CUBEB_SAMPLE_FLOAT32LE) {
        local_b8.le = 1;
        local_b8.msb = 0;
        local_b8.bits = 0x18;
      }
      else {
        if (cVar3 == CUBEB_SAMPLE_S16BE) {
          local_b8._12_8_ = (ulong)local_b8.msb << 0x20;
        }
        else {
          if (cVar3 != CUBEB_SAMPLE_S16LE) goto LAB_0011173d;
          local_b8.le = 1;
        }
        local_b8.bits = 0x10;
      }
      local_b8.bps = 1;
      if (8 < local_b8.bits) {
        local_b8.bps = (0x10 < local_b8.bits) + 2 + (uint)(0x10 < local_b8.bits);
      }
      if ((__s->mode & 2U) != 0) {
        local_b8.rchan = input_stream_params->channels;
      }
      if ((__s->mode & 1U) != 0) {
        local_b8.pchan = output_stream_params->channels;
      }
      local_b8.appbufsz = latency_frames;
      local_b8.rate = uVar9;
      iVar4 = (*cubeb_sio_setpar)(__s->hdl,&local_b8);
      if ((((((iVar4 != 0) && (iVar4 = (*cubeb_sio_getpar)(__s->hdl,&local_70), iVar4 != 0)) &&
            (local_70.bits == local_b8.bits)) &&
           ((local_70.le == local_b8.le && (local_70.sig == local_b8.sig)))) &&
          (((local_70.bps == local_b8.bps &&
            ((local_b8.bps << 3 <= local_b8.bits || (local_70.msb == local_b8.msb)))) &&
           (local_70.rate == local_b8.rate)))) &&
         ((((__s->mode & 2U) == 0 || (local_70.rchan == local_b8.rchan)) &&
          (((__s->mode & 1U) == 0 || (local_70.pchan == local_b8.pchan)))))) {
        (*cubeb_sio_onmove)(__s->hdl,sndio_onmove,__s);
        __s->active = 0;
        __s->nfr = local_70.round;
        uVar11 = (ulong)local_70.bps;
        __s->rbpf = local_70.rchan * local_70.bps;
        __s->pbpf = local_70.pchan * local_70.bps;
        __s->rchan = local_70.rchan;
        __s->pchan = local_70.pchan;
        __s->nblks = local_70.bufsz / local_70.round;
        __s->data_cb = data_callback;
        __s->state_cb = state_callback;
        __s->arg = user_ptr;
        __s->hwpos = 0;
        __s->swpos = 0;
        (__s->mtx).__align = 0;
        *(undefined8 *)((long)&__s->mtx + 8) = 0;
        *(undefined8 *)((long)&__s->mtx + 0x10) = 0;
        (__s->mtx).__data.__list.__prev = (__pthread_internal_list *)0x0;
        (__s->mtx).__data.__list.__next = (__pthread_internal_list *)0x0;
        if (cVar3 == CUBEB_SAMPLE_FLOAT32LE) {
          __s->conv = 1;
          uVar11 = 4;
        }
        else {
          __s->conv = 0;
        }
        uVar1 = __s->mode;
        if ((uVar1 & 1) != 0) {
          puVar8 = (uchar *)malloc((ulong)local_70.pchan * (ulong)local_70.round * uVar11);
          __s->pbuf = puVar8;
          if (puVar8 == (uchar *)0x0) goto LAB_0011173d;
        }
        if ((uVar1 & 2) != 0) {
          puVar8 = (uchar *)malloc((ulong)local_70.rchan * (ulong)local_70.round * uVar11);
          __s->rbuf = puVar8;
          if (puVar8 == (uchar *)0x0) goto LAB_0011173d;
        }
        __s->volume = 1.0;
        *local_78 = __s;
        return 0;
      }
    }
  }
LAB_0011173d:
  if (__s->hdl != (sio_hdl *)0x0) {
    (*cubeb_sio_close)(__s->hdl);
  }
  if (__s->pbuf != (uchar *)0x0) {
    free(__s->pbuf);
  }
  if (__s->rbuf != (uchar *)0x0) {
    free(__s->pbuf);
  }
  free(__s);
  return -1;
}

Assistant:

static int
sndio_stream_init(cubeb * context, cubeb_stream ** stream,
                  char const * stream_name, cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback, void * user_ptr)
{
  cubeb_stream * s;
  struct sio_par wpar, rpar;
  cubeb_sample_format format;
  int rate;
  size_t bps;

  DPR("sndio_stream_init(%s)\n", stream_name);

  s = malloc(sizeof(cubeb_stream));
  if (s == NULL)
    return CUBEB_ERROR;
  memset(s, 0, sizeof(cubeb_stream));
  s->mode = 0;
  if (input_stream_params) {
    if (input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_REC;
    format = input_stream_params->format;
    rate = input_stream_params->rate;
  }
  if (output_stream_params) {
    if (output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_PLAY;
    format = output_stream_params->format;
    rate = output_stream_params->rate;
  }
  if (s->mode == 0) {
    DPR("sndio_stream_init(), neither playing nor recording\n");
    goto err;
  }
  s->context = context;
  s->hdl = WRAP(sio_open)(sndio_get_device(), s->mode, 1);
  if (s->hdl == NULL) {
    DPR("sndio_stream_init(), sio_open() failed\n");
    goto err;
  }
  WRAP(sio_initpar)(&wpar);
  wpar.sig = 1;
  switch (format) {
  case CUBEB_SAMPLE_S16LE:
    wpar.le = 1;
    wpar.bits = 16;
    break;
  case CUBEB_SAMPLE_S16BE:
    wpar.le = 0;
    wpar.bits = 16;
    break;
  case CUBEB_SAMPLE_FLOAT32NE:
    wpar.le = SIO_LE_NATIVE;
    wpar.bits = 24;
    wpar.msb = 0;
    break;
  default:
    DPR("sndio_stream_init() unsupported format\n");
    goto err;
  }
  wpar.bps = SIO_BPS(wpar.bits);
  wpar.rate = rate;
  if (s->mode & SIO_REC)
    wpar.rchan = input_stream_params->channels;
  if (s->mode & SIO_PLAY)
    wpar.pchan = output_stream_params->channels;
  wpar.appbufsz = latency_frames;
  if (!WRAP(sio_setpar)(s->hdl, &wpar) || !WRAP(sio_getpar)(s->hdl, &rpar)) {
    DPR("sndio_stream_init(), sio_setpar() failed\n");
    goto err;
  }
  if (rpar.bits != wpar.bits || rpar.le != wpar.le || rpar.sig != wpar.sig ||
      rpar.bps != wpar.bps ||
      (wpar.bits < 8 * wpar.bps && rpar.msb != wpar.msb) ||
      rpar.rate != wpar.rate ||
      ((s->mode & SIO_REC) && rpar.rchan != wpar.rchan) ||
      ((s->mode & SIO_PLAY) && rpar.pchan != wpar.pchan)) {
    DPR("sndio_stream_init() unsupported params\n");
    goto err;
  }
  WRAP(sio_onmove)(s->hdl, sndio_onmove, s);
  s->active = 0;
  s->nfr = rpar.round;
  s->rbpf = rpar.bps * rpar.rchan;
  s->pbpf = rpar.bps * rpar.pchan;
  s->rchan = rpar.rchan;
  s->pchan = rpar.pchan;
  s->nblks = rpar.bufsz / rpar.round;
  s->data_cb = data_callback;
  s->state_cb = state_callback;
  s->arg = user_ptr;
  s->mtx = (pthread_mutex_t)PTHREAD_MUTEX_INITIALIZER;
  s->hwpos = s->swpos = 0;
  if (format == CUBEB_SAMPLE_FLOAT32LE) {
    s->conv = 1;
    bps = sizeof(float);
  } else {
    s->conv = 0;
    bps = rpar.bps;
  }
  if (s->mode & SIO_PLAY) {
    s->pbuf = malloc(bps * rpar.pchan * rpar.round);
    if (s->pbuf == NULL)
      goto err;
  }
  if (s->mode & SIO_REC) {
    s->rbuf = malloc(bps * rpar.rchan * rpar.round);
    if (s->rbuf == NULL)
      goto err;
  }
  s->volume = 1.;
  *stream = s;
  DPR("sndio_stream_init() end, ok\n");
  (void)context;
  (void)stream_name;
  return CUBEB_OK;
err:
  if (s->hdl)
    WRAP(sio_close)(s->hdl);
  if (s->pbuf)
    free(s->pbuf);
  if (s->rbuf)
    free(s->pbuf);
  free(s);
  return CUBEB_ERROR;
}